

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_scalar_literal
          (Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,csubstr s,size_t ilevel,bool explicit_key,bool explicit_indentation)

{
  ulong uVar1;
  char *pcVar2;
  code *pcVar3;
  csubstr sp;
  size_t sVar4;
  error_flags eVar5;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar10;
  char (*a) [3];
  undefined3 in_register_00000081;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  basic_substring<const_char> bVar16;
  ro_substr chars;
  csubstr sp_00;
  long local_70;
  basic_substring<const_char> local_50;
  csubstr s_local;
  ulong uVar9;
  
  s_local.len = s.len;
  s_local.str = s.str;
  if (CONCAT31(in_register_00000081,explicit_key) != 0) {
    WriterOStream<std::__cxx11::stringstream>::_do_write<3ul>
              ((WriterOStream<std::__cxx11::stringstream> *)this,(char (*) [3])"? ");
  }
  chars.len = 2;
  chars.str = "\n\r";
  bVar16 = basic_substring<const_char>::trimr(&s_local,chars);
  sVar4 = s_local.len;
  uVar11 = bVar16.len;
  pcVar6 = bVar16.str;
  if (s_local.len < uVar11) {
    eVar5 = get_error_flags();
    if (((eVar5 & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    handle_error(0x1ea013,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1533,"first >= 0 && first <= len");
  }
  basic_substring<const_char>::basic_substring(&local_50,s_local.str + uVar11,s_local.len - uVar11);
  sVar7 = basic_substring<const_char>::count(&local_50,'\r',0);
  uVar10 = sVar4 - (sVar7 + uVar11);
  if (explicit_indentation) {
    WriterOStream<std::__cxx11::stringstream>::_do_write<3ul>
              ((WriterOStream<std::__cxx11::stringstream> *)this,(char (*) [3])"|2");
  }
  else {
    WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(&this->
                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,'|');
  }
  if ((uVar10 < 2) && ((uVar11 != 0 || (s_local.len == 0)))) {
    if (uVar10 == 1) {
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(&this->
                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ,'\n');
      goto LAB_00194c16;
    }
    a = (char (*) [3])0x1e3f22;
  }
  else {
    a = (char (*) [3])0x1ea4d1;
  }
  WriterOStream<std::__cxx11::stringstream>::_do_write<3ul>
            ((WriterOStream<std::__cxx11::stringstream> *)this,a);
LAB_00194c16:
  if (uVar11 != 0) {
    lVar14 = ilevel + 1;
    uVar8 = 0;
    uVar9 = 0;
    while (uVar11 != uVar8) {
      uVar1 = uVar8 + 1;
      pcVar2 = pcVar6 + uVar8;
      uVar8 = uVar1;
      if (*pcVar2 == '\n') {
        if (uVar11 < uVar9) {
          eVar5 = get_error_flags();
          if (((eVar5 & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          handle_error(0x1ea013,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1544,"first >= 0 && first <= len");
        }
        uVar12 = uVar1;
        if (uVar1 == 0xffffffffffffffff) {
          uVar12 = uVar11;
        }
        if (uVar12 < uVar9) {
          eVar5 = get_error_flags();
          if (((eVar5 & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          handle_error(0x1ea013,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1546,"first <= last");
        }
        if (uVar11 < uVar12) {
          eVar5 = get_error_flags();
          if (((eVar5 & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          handle_error(0x1ea013,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1547,"last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring(&local_50,pcVar6 + uVar9,uVar12 - uVar9);
        sVar4 = local_50.len;
        pcVar2 = local_50.str;
        lVar13 = lVar14;
        while (bVar15 = lVar13 != 0, lVar13 = lVar13 + -1, bVar15) {
          WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write(&this->
                       super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ,' ');
          WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write(&this->
                       super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ,' ');
        }
        sp_00.len = sVar4;
        sp_00.str = pcVar2;
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(&this->
                     super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,sp_00);
        uVar9 = uVar1;
      }
    }
    if (uVar9 <= uVar11 && uVar11 - uVar9 != 0) {
      while (bVar15 = lVar14 != 0, lVar14 = lVar14 + -1, bVar15) {
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(&this->
                     super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,' ');
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(&this->
                     super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,' ');
      }
      basic_substring<const_char>::basic_substring(&local_50,pcVar6 + uVar9,uVar11 - uVar9);
      sp.len = local_50.len;
      sp.str = local_50.str;
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(&this->
                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ,sp);
    }
    if (uVar10 == 0) {
      uVar10 = 0;
    }
    else {
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(&this->
                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ,'\n');
      uVar10 = uVar10 - 1;
    }
  }
  local_70 = ilevel + 1;
  uVar11 = 0;
  while (lVar14 = local_70, uVar11 != uVar10) {
    while (bVar15 = lVar14 != 0, lVar14 = lVar14 + -1, bVar15) {
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(&this->
                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ,' ');
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(&this->
                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ,' ');
    }
    uVar11 = uVar11 + 1;
    if (uVar11 < uVar10 || explicit_key) {
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(&this->
                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ,'\n');
    }
  }
  if (explicit_key && uVar10 == 0) {
    WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(&this->
                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,'\n');
  }
  return;
}

Assistant:

void Emitter<Writer>::_write_scalar_literal(csubstr s, size_t ilevel, bool explicit_key, bool explicit_indentation)
{
    if(explicit_key)
        this->Writer::_do_write("? ");
    csubstr trimmed = s.trimr("\n\r");
    size_t numnewlines_at_end = s.len - trimmed.len - s.sub(trimmed.len).count('\r');
    //
    if(!explicit_indentation)
        this->Writer::_do_write('|');
    else
        this->Writer::_do_write("|2");
    //
    if(numnewlines_at_end > 1 || (trimmed.len == 0 && s.len > 0)/*only newlines*/)
        this->Writer::_do_write("+\n");
    else if(numnewlines_at_end == 1)
        this->Writer::_do_write('\n');
    else
        this->Writer::_do_write("-\n");
    //
    if(trimmed.len)
    {
        size_t pos = 0; // tracks the last character that was already written
        for(size_t i = 0; i < trimmed.len; ++i)
        {
            if(trimmed[i] != '\n')
                continue;
            // write everything up to this point
            csubstr since_pos = trimmed.range(pos, i+1); // include the newline
            _rymlindent_nextline()
            this->Writer::_do_write(since_pos);
            pos = i+1; // already written
        }
        if(pos < trimmed.len)
        {
            _rymlindent_nextline()
            this->Writer::_do_write(trimmed.sub(pos));
        }
        if(numnewlines_at_end)
        {
            this->Writer::_do_write('\n');
            --numnewlines_at_end;
        }
    }
    for(size_t i = 0; i < numnewlines_at_end; ++i)
    {
        _rymlindent_nextline()
        if(i+1 < numnewlines_at_end || explicit_key)
            this->Writer::_do_write('\n');
    }
    if(explicit_key && !numnewlines_at_end)
        this->Writer::_do_write('\n');
}